

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O0

void __thiscall tf::NonblockingNotifierV2::notify_n(NonblockingNotifierV2 *this,size_t n)

{
  size_type sVar1;
  ulong in_RSI;
  long in_RDI;
  size_t k;
  NonblockingNotifierV2 *in_stack_00000150;
  NonblockingNotifierV2 *in_stack_00000178;
  undefined8 local_18;
  
  sVar1 = std::
          vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
          ::size((vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                  *)(in_RDI + 8));
  if (in_RSI < sVar1) {
    for (local_18 = 0; local_18 < in_RSI; local_18 = local_18 + 1) {
      _notify<false>(in_stack_00000178);
    }
  }
  else {
    _notify<true>(in_stack_00000150);
  }
  return;
}

Assistant:

void notify_n(size_t n) {
    if(n >= _waiters.size()) {
      _notify<true>();
    }
    else {
      for(size_t k=0; k<n; ++k) {
        _notify<false>();
      }
    }
  }